

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionUtilsBullet.cpp
# Opt level: O1

bool chrono::collision::bt_utils::IntersectSegmentCylinder
               (cbtVector3 *sC,cbtVector3 *sD,cbtScalar sH,cbtVector3 *cC,cbtVector3 *cD,
               cbtScalar cH,cbtScalar cR,cbtScalar tol,cbtScalar *tMin,cbtScalar *tMax)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  bool bVar7;
  cbtScalar *t;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  float fVar13;
  undefined1 in_register_00001204 [60];
  undefined1 auVar15 [64];
  undefined1 in_register_00001284 [60];
  undefined1 auVar16 [64];
  float fVar17;
  float fVar18;
  cbtScalar t1;
  cbtScalar t2;
  float local_e0;
  float local_dc;
  float *local_d8;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  cbtVector3 local_40;
  
  auVar16._4_60_ = in_register_00001284;
  auVar16._0_4_ = cR;
  auVar15._4_60_ = in_register_00001204;
  auVar15._0_4_ = sH;
  auVar12 = auVar15._0_16_;
  *tMin = -1e+18;
  *tMax = 1e+18;
  fVar1 = sC->m_floats[0] - cC->m_floats[0];
  fVar2 = sC->m_floats[1] - cC->m_floats[1];
  fVar3 = sC->m_floats[2] - cC->m_floats[2];
  fVar8 = cD->m_floats[0];
  fVar13 = cD->m_floats[1];
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(sD->m_floats[1] * fVar13)),ZEXT416((uint)fVar8),
                            ZEXT416((uint)sD->m_floats[0]));
  fVar18 = cD->m_floats[2];
  auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar18),ZEXT416((uint)sD->m_floats[2]));
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar13)),ZEXT416((uint)fVar1),
                            ZEXT416((uint)fVar8));
  auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)fVar3),ZEXT416((uint)fVar18));
  auVar9 = vfnmadd231ss_avx512f(ZEXT416(0x3f800000),auVar11,auVar11);
  auVar10._8_4_ = 0x7fffffff;
  auVar10._0_8_ = 0x7fffffff7fffffff;
  auVar10._12_4_ = 0x7fffffff;
  auVar10 = vandps_avx512vl(auVar9,auVar10);
  local_88 = auVar12;
  if (tol <= auVar10._0_4_) {
    auVar10 = vfmadd213ss_fma(ZEXT416((uint)sD->m_floats[0]),ZEXT416((uint)fVar1),
                              ZEXT416((uint)(fVar2 * sD->m_floats[1])));
    auVar10 = vfmadd213ss_fma(ZEXT416((uint)sD->m_floats[2]),ZEXT416((uint)fVar3),auVar10);
    auVar12._8_4_ = 0x80000000;
    auVar12._0_8_ = 0x8000000080000000;
    auVar12._12_4_ = 0x80000000;
    auVar12 = vxorps_avx512vl(auVar14,auVar12);
    auVar10 = vfnmadd213ss_fma(auVar11,auVar14,auVar10);
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar2)),ZEXT416((uint)fVar1),
                              ZEXT416((uint)fVar1));
    auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
    auVar11 = vfmadd231ss_fma(auVar11,auVar14,auVar12);
    auVar11 = vfnmadd213ss_fma(auVar16._0_16_,auVar16._0_16_,auVar11);
    auVar11 = vmulss_avx512f(auVar11,auVar9);
    auVar11 = vfmsub231ss_fma(auVar11,auVar10,auVar10);
    fVar8 = auVar11._0_4_;
    if (fVar8 < 0.0) {
      return false;
    }
    if (fVar8 < 0.0) {
      local_b8 = auVar9;
      local_a8 = auVar10;
      fVar8 = sqrtf(fVar8);
      auVar10 = local_a8;
      auVar9 = local_b8;
    }
    else {
      auVar11 = vsqrtss_avx(auVar11,auVar11);
      fVar8 = auVar11._0_4_;
    }
    auVar11._8_4_ = 0x80000000;
    auVar11._0_8_ = 0x8000000080000000;
    auVar11._12_4_ = 0x80000000;
    auVar11 = vxorps_avx512vl(auVar10,auVar11);
    auVar11 = vdivss_avx512f(ZEXT416((uint)(auVar11._0_4_ - fVar8)),auVar9);
    *tMin = auVar11._0_4_;
    auVar12 = vdivss_avx512f(ZEXT416((uint)(fVar8 - auVar10._0_4_)),auVar9);
  }
  else {
    fVar17 = auVar14._0_4_;
    fVar2 = fVar2 - fVar13 * fVar17;
    auVar11 = ZEXT416((uint)(fVar1 - fVar8 * fVar17));
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar2)),auVar11,auVar11);
    auVar14 = ZEXT416((uint)(fVar3 - fVar18 * fVar17));
    auVar11 = vfmadd231ss_fma(auVar11,auVar14,auVar14);
    if (cR * cR < auVar11._0_4_) {
      return false;
    }
    auVar14._8_4_ = 0x80000000;
    auVar14._0_8_ = 0x8000000080000000;
    auVar14._12_4_ = 0x80000000;
    auVar11 = vxorps_avx512vl(auVar12,auVar14);
    *tMin = auVar11._0_4_;
  }
  *tMax = auVar12._0_4_;
  local_c8 = cD->m_floats[0];
  local_d0 = cD->m_floats[1];
  local_98._0_4_ = local_c8 * cH;
  local_bc = local_d0 * cH;
  local_cc = cD->m_floats[2];
  local_c0 = local_cc * cH;
  local_a8._0_4_ = cC->m_floats[0];
  local_b8._0_4_ = cC->m_floats[1];
  local_c4 = cC->m_floats[2];
  local_58 = ZEXT416((uint)(local_c8 * cH + cC->m_floats[0]));
  local_68 = ZEXT416((uint)(local_bc + cC->m_floats[1]));
  auVar11 = vinsertps_avx(local_58,local_68,0x10);
  local_78 = ZEXT416((uint)(local_c0 + local_c4));
  local_40.m_floats = (cbtScalar  [4])vinsertps_avx(auVar11,local_78,0x28);
  local_d8 = tMin;
  bVar6 = IntersectLinePlane(sC,sD,&local_40,cD,tol,&local_e0);
  local_a8 = ZEXT416((uint)((float)local_a8._0_4_ - (float)local_98._0_4_));
  local_b8 = ZEXT416((uint)((float)local_b8._0_4_ - local_bc));
  auVar11 = vinsertps_avx(local_a8,local_b8,0x10);
  local_98 = ZEXT416((uint)(local_c4 - local_c0));
  local_40.m_floats = (cbtScalar  [4])vinsertps_avx(auVar11,local_98,0x28);
  t = &local_dc;
  bVar7 = IntersectLinePlane(sC,sD,&local_40,cD,tol,t);
  if (bVar6 != bVar7) {
    __assert_fail("code1 == code2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/ChCollisionUtilsBullet.cpp"
                  ,0x11b,
                  "bool chrono::collision::bt_utils::IntersectSegmentCylinder(const cbtVector3 &, const cbtVector3 &, const cbtScalar, const cbtVector3 &, const cbtVector3 &, const cbtScalar, const cbtScalar, const cbtScalar, cbtScalar &, cbtScalar &)"
                 );
  }
  if (bVar6 && bVar7) {
    fVar8 = *local_d8;
    if (local_dc <= local_e0) {
      uVar4 = vcmpss_avx512f(ZEXT416((uint)local_dc),ZEXT416((uint)fVar8),1);
      bVar6 = (bool)((byte)uVar4 & 1);
      fVar8 = (float)((uint)bVar6 * (int)fVar8 + (uint)!bVar6 * (int)local_dc);
      t = &local_e0;
      local_dc = local_e0;
    }
    else {
      uVar4 = vcmpss_avx512f(ZEXT416((uint)local_e0),ZEXT416((uint)fVar8),1);
      bVar6 = (bool)((byte)uVar4 & 1);
      fVar8 = (float)((uint)bVar6 * (int)fVar8 + (uint)!bVar6 * (int)local_e0);
    }
    *local_d8 = fVar8;
    if (*tMax < local_dc) {
      t = tMax;
    }
    fVar8 = *t;
    *tMax = fVar8;
    if (fVar8 < *local_d8) {
      return false;
    }
  }
  else {
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(local_d0 * ((float)local_68._0_4_ - sC->m_floats[1]))),
                              ZEXT416((uint)local_c8),
                              ZEXT416((uint)((float)local_58._0_4_ - sC->m_floats[0])));
    auVar9._8_4_ = 0x7fffffff;
    auVar9._0_8_ = 0x7fffffff7fffffff;
    auVar9._12_4_ = 0x7fffffff;
    auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)local_cc),
                              ZEXT416((uint)((float)local_78._0_4_ - sC->m_floats[2])));
    auVar11 = vandps_avx(auVar11,auVar9);
    if (cH + cH < auVar11._0_4_) {
      return false;
    }
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(local_d0 * ((float)local_b8._0_4_ - sC->m_floats[1]))),
                              ZEXT416((uint)local_c8),
                              ZEXT416((uint)((float)local_a8._0_4_ - sC->m_floats[0])));
    auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)local_cc),
                              ZEXT416((uint)((float)local_98._0_4_ - sC->m_floats[2])));
    auVar11 = vandps_avx(auVar11,auVar9);
    if (cH + cH < auVar11._0_4_) {
      return false;
    }
  }
  fVar8 = *local_d8;
  auVar5._8_4_ = 0x80000000;
  auVar5._0_8_ = 0x8000000080000000;
  auVar5._12_4_ = 0x80000000;
  auVar11 = vxorps_avx512vl(local_88,auVar5);
  fVar13 = auVar11._0_4_;
  if (((fVar8 < fVar13) && (*tMax < fVar13)) ||
     ((fVar18 = local_88._0_4_, fVar18 < fVar8 && (fVar18 < *tMax)))) {
    return false;
  }
  if ((fVar8 < fVar13) || (fVar18 < fVar8)) {
    uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar8),auVar11,1);
    bVar6 = (bool)((byte)uVar4 & 1);
    *local_d8 = (float)((uint)bVar6 * (int)fVar13 + (uint)!bVar6 * (int)fVar18);
  }
  if ((*tMax < fVar13) || (auVar11 = local_88, fVar18 < *tMax)) {
    *tMax = auVar11._0_4_;
  }
  if (*tMax < *local_d8) {
    __assert_fail("tMin <= tMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/ChCollisionUtilsBullet.cpp"
                  ,0x137,
                  "bool chrono::collision::bt_utils::IntersectSegmentCylinder(const cbtVector3 &, const cbtVector3 &, const cbtScalar, const cbtVector3 &, const cbtVector3 &, const cbtScalar, const cbtScalar, const cbtScalar, cbtScalar &, cbtScalar &)"
                 );
  }
  return true;
}

Assistant:

bool IntersectSegmentCylinder(const cbtVector3& sC,  // segment center point
                              const cbtVector3& sD,  // segment direction (unit vector)
                              const cbtScalar sH,    // segment half-length
                              const cbtVector3& cC,  // cylinder axis center
                              const cbtVector3& cD,  // cylinder axis direction (unit vector)
                              const cbtScalar cH,    // cylinder axis half-length (cylinder halh-height)
                              const cbtScalar cR,    // cylinder radius
                              const cbtScalar tol,   // tolerance for parallelism test
                              cbtScalar& tMin,       // segment parameter of first intersection point
                              cbtScalar& tMax        // segment parameter of second intersection point
) {
    tMin = -BT_LARGE_FLOAT;
    tMax = +BT_LARGE_FLOAT;

    cbtVector3 v = sC - cC;
    cbtScalar cDsD = cD.dot(sD);
    cbtScalar vcD = v.dot(cD);
    cbtScalar vsD = v.dot(sD);
    cbtScalar vv = v.dot(v);
    cbtScalar a = 1 - cDsD * cDsD;
    cbtScalar b = vsD - vcD * cDsD;
    cbtScalar c = vv - vcD * vcD - cR * cR;

    // Intersection with cylindrical surface.
    // a >= 0 always
    // a == 0 indicates line parallel to cylinder axis
    if (std::abs(a) < tol) {
        // line parallel to cylinder axis
        cbtScalar dist2 = (v - vcD * cD).length2();
        if (dist2 > cR * cR)
            return false;
        tMin = -sH;
        tMax = +sH;
    } else {
        // line intersects cylindrical surface
        cbtScalar discr = b * b - a * c;
        if (discr < 0)
            return false;  // no real roots, no intersection
        discr = cbtSqrt(discr);
        tMin = (-b - discr) / a;
        tMax = (-b + discr) / a;
    }

    // Intersection with end-caps.
    cbtScalar t1;
    bool code1 = IntersectLinePlane(sC, sD, cC + cH * cD, cD, tol, t1);
    cbtScalar t2;
    bool code2 = IntersectLinePlane(sC, sD, cC - cH * cD, cD, tol, t2);
    assert(code1 == code2);
    if (code1 && code2) {
        // line intersects end-caps
        if (t1 < t2) {
            tMin = cbtMax(tMin, t1);
            tMax = cbtMin(tMax, t2);
        } else {
            tMin = cbtMax(tMin, t2);
            tMax = cbtMin(tMax, t1);
        }
        if (tMax < tMin)
            return false;
    } else {
        // line parallel to end-cap planes
        cbtScalar d1 = std::abs(cD.dot(cC + cH * cD - sC));
        cbtScalar d2 = std::abs(cD.dot(cC - cH * cD - sC));
        if (d1 > 2 * cH || d2 > 2 * cH)
            return false;
    }

    // If both intersection points are outside the segment, no intersection
    if ((tMin < -sH && tMax < -sH) || (tMin > +sH && tMax > +sH))
        return false;

    // Clamp to segment length
    cbtClamp(tMin, -sH, +sH);
    cbtClamp(tMax, -sH, +sH);

    assert(tMin <= tMax);

    return true;
}